

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  TestCase *this;
  TestInfo *this_00;
  TestResult *this_01;
  char *pcVar3;
  char *pcVar4;
  TestInfo *test_info;
  int j;
  TestCase *test_case;
  int i;
  int failed_test_count;
  UnitTest *unit_test_local;
  
  iVar2 = UnitTest::failed_test_count(unit_test);
  if (iVar2 != 0) {
    for (test_case._0_4_ = 0; iVar2 = UnitTest::total_test_case_count(unit_test),
        (int)test_case < iVar2; test_case._0_4_ = (int)test_case + 1) {
      this = UnitTest::GetTestCase(unit_test,(int)test_case);
      bVar1 = TestCase::should_run(this);
      if ((bVar1) && (iVar2 = TestCase::failed_test_count(this), iVar2 != 0)) {
        for (test_info._4_4_ = 0; iVar2 = TestCase::total_test_count(this), test_info._4_4_ < iVar2;
            test_info._4_4_ = test_info._4_4_ + 1) {
          this_00 = TestCase::GetTestInfo(this,test_info._4_4_);
          bVar1 = TestInfo::should_run(this_00);
          if (bVar1) {
            this_01 = TestInfo::result(this_00);
            bVar1 = TestResult::Passed(this_01);
            if (!bVar1) {
              ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
              pcVar3 = TestCase::name(this);
              pcVar4 = TestInfo::name(this_00);
              printf("%s.%s",pcVar3,pcVar4);
              PrintFullTestCommentIfPresent(this_00);
              printf("\n");
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  if (failed_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    const TestCase& test_case = *unit_test.GetTestCase(i);
    if (!test_case.should_run() || (test_case.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_case.total_test_count(); ++j) {
      const TestInfo& test_info = *test_case.GetTestInfo(j);
      if (!test_info.should_run() || test_info.result()->Passed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_case.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
}